

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void cs::foreach_helper<cs::range_type,cs::numeric>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  element_type *peVar1;
  stack_pointer psVar2;
  bool bVar3;
  range_type *prVar4;
  stack_type<cs::domain_type,_std::allocator> *this;
  scope_guard scope;
  
  prVar4 = cs_impl::any::const_val<cs::range_type>(obj);
  bVar3 = numeric::operator==(&prVar4->m_start,&prVar4->m_stop);
  if (!bVar3) {
    peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->break_block == true) {
      peVar1->break_block = false;
    }
    if (peVar1->continue_block == true) {
      peVar1->continue_block = false;
    }
    psVar2 = *(peVar1->super_runtime_type).storage.fiber_stack;
    this = &(peVar1->super_runtime_type).storage.m_data;
    if (psVar2 != (stack_pointer)0x0) {
      this = psVar2;
    }
    stack_type<cs::domain_type,_std::allocator>::push<>(this);
    prVar4 = cs_impl::any::const_val<cs::range_type>(obj);
    (*(code *)(&DAT_001f0eb4 +
              *(int *)(&DAT_001f0eb4 +
                      (ulong)((uint)(prVar4->m_stop).type + ((prVar4->m_start).type & 1) * 2) * 4)))
              ();
    return;
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}